

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenLoopSetName(BinaryenExpressionRef expr,char *name)

{
  Name local_28;
  
  if (expr->_id == LoopId) {
    wasm::Name::Name(&local_28,name);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("expression->is<Loop>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x829,"void BinaryenLoopSetName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenLoopSetName(BinaryenExpressionRef expr, const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Loop>());
  // may be null or empty
  static_cast<Loop*>(expression)->name = name;
}